

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TFunction * __thiscall
glslang::HlslParseContext::makeConstructorCall(HlslParseContext *this,TSourceLoc *loc,TType *type)

{
  TOperator tOp;
  TFunction *this_00;
  char *pcVar1;
  TString empty;
  pool_allocator<char> local_58;
  TString local_50;
  
  tOp = TIntermediate::mapTypeToConstructorOp
                  ((this->super_TParseContextBase).super_TParseVersions.intermediate,type);
  if (tOp == EOpNull) {
    pcVar1 = TType::getBasicString(type);
    this_00 = (TFunction *)0x0;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot construct this type",pcVar1,"");
  }
  else {
    local_58.allocator = GetThreadPoolAllocator();
    pcVar1 = "";
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_50,
               "",&local_58);
    this_00 = (TFunction *)TSymbol::operator_new((TSymbol *)0x160,(size_t)pcVar1);
    TFunction::TFunction(this_00,&local_50,type,tOp);
  }
  return this_00;
}

Assistant:

TFunction* HlslParseContext::makeConstructorCall(const TSourceLoc& loc, const TType& type)
{
    TOperator op = intermediate.mapTypeToConstructorOp(type);

    if (op == EOpNull) {
        error(loc, "cannot construct this type", type.getBasicString(), "");
        return nullptr;
    }

    TString empty("");

    return new TFunction(&empty, type, op);
}